

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.cpp
# Opt level: O2

void __thiscall
WFC::WFC(WFC *this,bool periodic_output,int seed,
        vector<double,_std::allocator<double>_> *patterns_frequencies,PropagatorState *propagator,
        uint wave_height,uint wave_width)

{
  uint wave_width_00;
  uint wave_height_00;
  double *pdVar1;
  unsigned_long __res;
  double *pdVar2;
  double *pdVar3;
  vector<double,_std::allocator<double>_> *__range1;
  double dVar4;
  vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
  vStack_48;
  
  (this->gen)._M_x = (ulong)(long)seed % 0x7fffffff + (ulong)((ulong)(long)seed % 0x7fffffff == 0);
  pdVar1 = (patterns_frequencies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  dVar4 = 0.0;
  pdVar2 = (patterns_frequencies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar3 = pdVar2; pdVar3 != pdVar1; pdVar3 = pdVar3 + 1) {
    dVar4 = dVar4 + *pdVar3;
  }
  for (; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    *pdVar2 = *pdVar2 * (1.0 / dVar4);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&this->patterns_frequencies,patterns_frequencies);
  Wave::Wave(&this->wave,wave_height,wave_width,patterns_frequencies);
  this->nb_patterns =
       ((long)(propagator->
              super__Vector_base<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
       (long)(propagator->
             super__Vector_base<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
             )._M_impl.super__Vector_impl_data._M_start) / 0x60;
  wave_width_00 = (this->wave).width;
  wave_height_00 = (this->wave).height;
  std::
  vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
  ::vector(&vStack_48,propagator);
  Propagator::Propagator(&this->propagator,wave_height_00,wave_width_00,periodic_output,&vStack_48);
  std::
  vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
  ::~vector(&vStack_48);
  return;
}

Assistant:

WFC::WFC(bool periodic_output, int seed,
         std::vector<double> patterns_frequencies,
         Propagator::PropagatorState propagator, unsigned wave_height,
         unsigned wave_width)
  noexcept
  : gen(seed), patterns_frequencies(normalize(patterns_frequencies)),
    wave(wave_height, wave_width, patterns_frequencies),
    nb_patterns(propagator.size()),
    propagator(wave.height, wave.width, periodic_output, propagator) {}